

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O1

void Imf_2_5::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  LevelMode LVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ArgExc *this;
  int iVar5;
  ulong uVar6;
  
  LVar1 = tileDesc->mode;
  iVar3 = 1;
  iVar5 = 1;
  if (LVar1 != ONE_LEVEL) {
    if (LVar1 == RIPMAP_LEVELS) {
      iVar5 = (maxX - minX) + 1;
    }
    else {
      if (LVar1 != MIPMAP_LEVELS) goto LAB_00151f77;
      iVar2 = (maxX - minX) + 1;
      iVar5 = (maxY - minY) + 1;
      if (iVar5 < iVar2) {
        iVar5 = iVar2;
      }
    }
    iVar5 = anon_unknown_15::roundLog2(iVar5,tileDesc->roundingMode);
    iVar5 = iVar5 + 1;
  }
  *numXLevels = iVar5;
  if (LVar1 != ONE_LEVEL) {
    if (LVar1 == RIPMAP_LEVELS) {
      iVar5 = (maxY - minY) + 1;
    }
    else {
      if (LVar1 != MIPMAP_LEVELS) {
LAB_00151f77:
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this,"Unknown LevelMode format.");
        __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      iVar3 = (maxX - minX) + 1;
      iVar5 = (maxY - minY) + 1;
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
    }
    iVar3 = anon_unknown_15::roundLog2(iVar5,tileDesc->roundingMode);
    iVar3 = iVar3 + 1;
  }
  *numYLevels = iVar3;
  iVar5 = *numXLevels;
  uVar6 = (long)iVar5 * 4;
  if ((long)iVar5 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar6);
  *numXTiles = piVar4;
  uVar6 = (long)iVar3 * 4;
  if (iVar3 < 0) {
    uVar6 = 0xffffffffffffffff;
  }
  piVar4 = (int *)operator_new__(uVar6);
  *numYTiles = piVar4;
  anon_unknown_15::calculateNumTiles
            (*numXTiles,iVar5,minX,maxX,tileDesc->xSize,tileDesc->roundingMode);
  anon_unknown_15::calculateNumTiles
            (*numYTiles,*numYLevels,minY,maxY,tileDesc->ySize,tileDesc->roundingMode);
  return;
}

Assistant:

void
precalculateTileInfo (const TileDescription& tileDesc,
		      int minX, int maxX,
		      int minY, int maxY,
		      int *&numXTiles, int *&numYTiles,
		      int &numXLevels, int &numYLevels)
{
    numXLevels = calculateNumXLevels(tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels(tileDesc, minX, maxX, minY, maxY);
    
    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (numXTiles,
		       numXLevels,
		       minX, maxX,
		       tileDesc.xSize,
		       tileDesc.roundingMode);

    calculateNumTiles (numYTiles,
		       numYLevels,
		       minY, maxY,
		       tileDesc.ySize,
		       tileDesc.roundingMode);
}